

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Gia_Man_t * Gia_ManInterOneInt(Gia_Man_t *pCof1,Gia_Man_t *pCof0,int Depth)

{
  int iVar1;
  Vec_Int_t *p;
  Gia_Obj_t *pGVar2;
  Gia_Man_t *pGVar3;
  Gia_Man_t *pGVar4;
  bool bVar5;
  Vec_Int_t *vFanCount;
  int iVarBest;
  int CountBest;
  int Count;
  int m;
  int n;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pFinal;
  Gia_Man_t *pInter [2];
  Gia_Man_t *local_60;
  Gia_Man_t *pTemp;
  Gia_Man_t *pCof [2] [2];
  Gia_Man_t *pGia [2];
  int Depth_local;
  Gia_Man_t *pCof0_local;
  Gia_Man_t *pCof1_local;
  
  pCof[1][1] = pCof0;
  memset(&pTemp,0,0x20);
  vFanCount._4_4_ = 0;
  vFanCount._0_4_ = -1;
  iVar1 = Gia_ManAndNum(pCof1);
  if ((iVar1 == 0) || (iVar1 = Gia_ManAndNum(pCof0), iVar1 == 0)) {
    pCof1_local = Gia_ManDup(pCof1);
  }
  else {
    iVar1 = Gia_ManCiNum(pCof0);
    p = Vec_IntStart(iVar1);
    for (Count = 0; Count < 2; Count = Count + 1) {
      m = 0;
      while( true ) {
        bVar5 = false;
        if (m < pGia[(long)Count + -1]->nObjs) {
          _n = Gia_ManObj(pGia[(long)Count + -1],m);
          bVar5 = _n != (Gia_Obj_t *)0x0;
        }
        if (!bVar5) break;
        iVar1 = Gia_ObjIsAnd(_n);
        if (iVar1 != 0) {
          pGVar2 = Gia_ObjFanin0(_n);
          iVar1 = Gia_ObjIsCi(pGVar2);
          if (iVar1 != 0) {
            pGVar2 = Gia_ObjFanin0(_n);
            iVar1 = Gia_ObjCioId(pGVar2);
            Vec_IntAddToEntry(p,iVar1,1);
          }
          pGVar2 = Gia_ObjFanin1(_n);
          iVar1 = Gia_ObjIsCi(pGVar2);
          if (iVar1 != 0) {
            pGVar2 = Gia_ObjFanin1(_n);
            iVar1 = Gia_ObjCioId(pGVar2);
            Vec_IntAddToEntry(p,iVar1,1);
          }
        }
        m = m + 1;
      }
    }
    for (m = 0; iVar1 = Vec_IntSize(p), m < iVar1; m = m + 1) {
      iVar1 = Vec_IntEntry(p,m);
      if (vFanCount._4_4_ < iVar1) {
        vFanCount._0_4_ = m;
        vFanCount._4_4_ = iVar1;
      }
    }
    Vec_IntFree(p);
    for (Count = 0; Count < 2; Count = Count + 1) {
      for (CountBest = 0; CountBest < 2; CountBest = CountBest + 1) {
        pGVar3 = Gia_ManDupCofactorVar(pGia[(long)Count + -1],(int)vFanCount,CountBest);
        pCof[(long)Count + -1][(long)CountBest + 1] = pGVar3;
        pGVar3 = pCof[(long)Count + -1][(long)CountBest + 1];
        pGVar4 = Acb_NtkEcoSynthesize(pGVar3);
        pCof[(long)Count + -1][(long)CountBest + 1] = pGVar4;
        Gia_ManStop(pGVar3);
        printf("%*sCof%d%d : ",(ulong)(8 - Depth),"",(ulong)(uint)Count,(ulong)(uint)CountBest);
        Gia_ManPrintStats(pCof[(long)Count + -1][(long)CountBest + 1],(Gps_Par_t *)0x0);
      }
    }
    for (CountBest = 0; CountBest < 2; CountBest = CountBest + 1) {
      iVar1 = Gia_ManAndNum(pGia[(long)CountBest + -3]);
      if ((iVar1 == 0) || (iVar1 = Gia_ManAndNum(pCof[-1][(long)CountBest + 1]), iVar1 == 0)) {
        pGVar3 = Gia_ManDup(pGia[(long)CountBest + -3]);
        pInter[(long)CountBest + -1] = pGVar3;
      }
      else if (Depth == 1) {
        pGVar3 = Gia_ManInterOne(pGia[(long)CountBest + -3],pCof[-1][(long)CountBest + 1],1);
        pInter[(long)CountBest + -1] = pGVar3;
      }
      else {
        pGVar3 = Gia_ManInterOneInt(pGia[(long)CountBest + -3],pCof[-1][(long)CountBest + 1],
                                    Depth + -1);
        pInter[(long)CountBest + -1] = pGVar3;
      }
      printf("%*sInter%d : ",(ulong)(8 - Depth),"",(ulong)(uint)CountBest);
      Gia_ManPrintStats(pInter[(long)CountBest + -1],(Gps_Par_t *)0x0);
      pGVar3 = pInter[(long)CountBest + -1];
      pGVar4 = Abc_GiaSynthesizeInter(pGVar3);
      pInter[(long)CountBest + -1] = pGVar4;
      Gia_ManStop(pGVar3);
      printf("%*sInter%d : ",(ulong)(8 - Depth),"",(ulong)(uint)CountBest);
      Gia_ManPrintStats(pInter[(long)CountBest + -1],(Gps_Par_t *)0x0);
    }
    for (Count = 0; Count < 2; Count = Count + 1) {
      for (CountBest = 0; CountBest < 2; CountBest = CountBest + 1) {
        Gia_ManStop(pCof[(long)Count + -1][(long)CountBest + 1]);
      }
    }
    pCof1_local = Gia_ManDupMux((int)vFanCount,pInter[0],pFinal);
    for (CountBest = 0; CountBest < 2; CountBest = CountBest + 1) {
      Gia_ManStop(pInter[(long)CountBest + -1]);
    }
  }
  return pCof1_local;
}

Assistant:

Gia_Man_t * Gia_ManInterOneInt( Gia_Man_t * pCof1, Gia_Man_t * pCof0, int Depth )
{
    extern Gia_Man_t * Gia_ManInterOne( Gia_Man_t * pNtkOn, Gia_Man_t * pNtkOff, int fVerbose );
    extern Gia_Man_t * Abc_GiaSynthesizeInter( Gia_Man_t * p );
    Gia_Man_t * pGia[2] = { pCof0, pCof1 };
    Gia_Man_t * pCof[2][2] = {{0}}, * pTemp;
    Gia_Man_t * pInter[2], * pFinal;
    Gia_Obj_t * pObj; 
    int i, n, m, Count, CountBest = 0, iVarBest = -1;
    // find PIs with the highest fanout
    Vec_Int_t * vFanCount;
    if ( Gia_ManAndNum(pCof1) == 0 || Gia_ManAndNum(pCof0) == 0 )
        return Gia_ManDup(pCof1);
    vFanCount = Vec_IntStart( Gia_ManCiNum(pCof0) );
    for ( n = 0; n < 2; n++ )
    {
        Gia_ManForEachAnd( pGia[n], pObj, i )
        {
            if ( Gia_ObjIsCi(Gia_ObjFanin0(pObj)) )
                Vec_IntAddToEntry( vFanCount, Gia_ObjCioId(Gia_ObjFanin0(pObj)), 1 );
            if ( Gia_ObjIsCi(Gia_ObjFanin1(pObj)) )
                Vec_IntAddToEntry( vFanCount, Gia_ObjCioId(Gia_ObjFanin1(pObj)), 1 );
        }
    }
    Vec_IntForEachEntry( vFanCount, Count, i )
        if ( CountBest < Count )
        {
            CountBest = Count;
            iVarBest = i;
        }
    Vec_IntFree( vFanCount );
    // Gia_Man_t * Gia_ManDupCofactorVar( Gia_Man_t * p, int iVar, int Value )
    for ( n = 0; n < 2; n++ )
    for ( m = 0; m < 2; m++ )
    {
        pCof[n][m] = Gia_ManDupCofactorVar( pGia[n], iVarBest, m );
        pCof[n][m] = Acb_NtkEcoSynthesize( pTemp = pCof[n][m] );
        Gia_ManStop( pTemp );
        printf( "%*sCof%d%d : ", 8-Depth, "", n, m );
        Gia_ManPrintStats( pCof[n][m], NULL );
    }
    for ( m = 0; m < 2; m++ )
    {
        if ( Gia_ManAndNum(pCof[1][m]) == 0 || Gia_ManAndNum(pCof[0][m]) == 0 )
            pInter[m] = Gia_ManDup( pCof[1][m] );
        else if ( Depth == 1 )
            pInter[m] = Gia_ManInterOne( pCof[1][m], pCof[0][m], 1 );
        else
            pInter[m] = Gia_ManInterOneInt( pCof[1][m], pCof[0][m], Depth-1 );
        printf( "%*sInter%d : ", 8-Depth, "", m );
        Gia_ManPrintStats( pInter[m], NULL );
        pInter[m] = Abc_GiaSynthesizeInter( pTemp = pInter[m] );
        Gia_ManStop( pTemp );
        printf( "%*sInter%d : ", 8-Depth, "", m );
        Gia_ManPrintStats( pInter[m], NULL );
    }
    for ( n = 0; n < 2; n++ )
    for ( m = 0; m < 2; m++ )
        Gia_ManStop( pCof[n][m] );
    pFinal = Gia_ManDupMux( iVarBest, pInter[1], pInter[0] );
    for ( m = 0; m < 2; m++ )
        Gia_ManStop( pInter[m] );
    return pFinal;
}